

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O0

void crnlib::LzmaEnc_Init(CLzmaEnc *p)

{
  uint uVar1;
  uint uVar2;
  uint local_2c;
  UInt32 j_1;
  UInt16 *probs;
  uint local_18;
  UInt32 num;
  UInt32 j;
  UInt32 i;
  CLzmaEnc *p_local;
  
  p->state = 0;
  for (num = 0; num < 4; num = num + 1) {
    p->reps[num] = 0;
  }
  RangeEnc_Init(&p->rc);
  for (num = 0; num < 0xc; num = num + 1) {
    for (local_18 = 0; local_18 < 0x10; local_18 = local_18 + 1) {
      p->isMatch[num][local_18] = 0x400;
      p->isRep0Long[num][local_18] = 0x400;
    }
    p->isRep[num] = 0x400;
    p->isRepG0[num] = 0x400;
    p->isRepG1[num] = 0x400;
    p->isRepG2[num] = 0x400;
  }
  uVar1 = p->lp;
  uVar2 = p->lc;
  for (num = 0; num < (uint)(0x300 << ((char)uVar1 + (char)uVar2 & 0x1fU)); num = num + 1) {
    p->litProbs[num] = 0x400;
  }
  for (num = 0; num < 4; num = num + 1) {
    for (local_2c = 0; local_2c < 0x40; local_2c = local_2c + 1) {
      p->posSlotEncoder[num][local_2c] = 0x400;
    }
  }
  for (num = 0; num < 0x72; num = num + 1) {
    p->posEncoders[num] = 0x400;
  }
  LenEnc_Init(&(p->lenEnc).p);
  LenEnc_Init(&(p->repLenEnc).p);
  for (num = 0; num < 0x10; num = num + 1) {
    p->posAlignEncoder[num] = 0x400;
  }
  p->optimumEndIndex = 0;
  p->optimumCurrentIndex = 0;
  p->additionalOffset = 0;
  p->pbMask = (1 << ((byte)p->pb & 0x1f)) - 1;
  p->lpMask = (1 << ((byte)p->lp & 0x1f)) - 1;
  return;
}

Assistant:

void LzmaEnc_Init(CLzmaEnc* p) {
  UInt32 i;
  p->state = 0;
  for (i = 0; i < LZMA_NUM_REPS; i++)
    p->reps[i] = 0;

  RangeEnc_Init(&p->rc);

  for (i = 0; i < kNumStates; i++) {
    UInt32 j;
    for (j = 0; j < LZMA_NUM_PB_STATES_MAX; j++) {
      p->isMatch[i][j] = kProbInitValue;
      p->isRep0Long[i][j] = kProbInitValue;
    }
    p->isRep[i] = kProbInitValue;
    p->isRepG0[i] = kProbInitValue;
    p->isRepG1[i] = kProbInitValue;
    p->isRepG2[i] = kProbInitValue;
  }

  {
    UInt32 num = 0x300 << (p->lp + p->lc);
    for (i = 0; i < num; i++)
      p->litProbs[i] = kProbInitValue;
  }

  {
    for (i = 0; i < kNumLenToPosStates; i++) {
      CLzmaProb* probs = p->posSlotEncoder[i];
      UInt32 j;
      for (j = 0; j < (1 << kNumPosSlotBits); j++)
        probs[j] = kProbInitValue;
    }
  }
  {
    for (i = 0; i < kNumFullDistances - kEndPosModelIndex; i++)
      p->posEncoders[i] = kProbInitValue;
  }

  LenEnc_Init(&p->lenEnc.p);
  LenEnc_Init(&p->repLenEnc.p);

  for (i = 0; i < (1 << kNumAlignBits); i++)
    p->posAlignEncoder[i] = kProbInitValue;

  p->optimumEndIndex = 0;
  p->optimumCurrentIndex = 0;
  p->additionalOffset = 0;

  p->pbMask = (1 << p->pb) - 1;
  p->lpMask = (1 << p->lp) - 1;
}